

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall CP::vector<int>::vector(vector<int> *this,vector<int> *a)

{
  ulong uVar1;
  size_t sVar2;
  int *piVar3;
  int *__s;
  long lVar4;
  size_t sVar5;
  ulong __n;
  
  uVar1 = a->mCap;
  __n = -(ulong)(uVar1 >> 0x3e != 0) | uVar1 * 4;
  __s = (int *)operator_new__(__n);
  memset(__s,0,__n);
  this->mData = __s;
  this->mCap = uVar1;
  this->mSize = a->mSize;
  sVar2 = a->mSize;
  if (sVar2 != 0) {
    piVar3 = a->mData;
    lVar4 = 0;
    sVar5 = 0;
    do {
      __s[sVar5] = *(int *)((long)piVar3 + (lVar4 >> 0x1e));
      sVar5 = sVar5 + 1;
      lVar4 = lVar4 + 0x100000000;
    } while (sVar2 != sVar5);
  }
  return;
}

Assistant:

vector(const vector<T>& a) {
      mData = new T[a.capacity()]();
      mCap = a.capacity();
      mSize = a.size();
      for (size_t i = 0;i < a.size();i++) {
        mData[i] = a[i];
      }
    }